

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_print(matd_t *m,char *fmt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (m == (matd_t *)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xbb,"void matd_print(const matd_t *, const char *)");
  }
  if (fmt != (char *)0x0) {
    if ((m->ncols < 2) && (m->nrows < 2)) {
      printf(fmt,m[1]);
      putchar(10);
      return;
    }
    if (m->nrows != 0) {
      uVar2 = 0;
      do {
        uVar1 = m->ncols;
        if (uVar1 != 0) {
          uVar3 = 0;
          do {
            printf(fmt,m[(ulong)(uVar1 * uVar2 + uVar3) + 1]);
            uVar3 = uVar3 + 1;
            uVar1 = m->ncols;
          } while (uVar3 < uVar1);
        }
        putchar(10);
        uVar2 = uVar2 + 1;
      } while (uVar2 < m->nrows);
    }
    return;
  }
  __assert_fail("fmt != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0xbc,"void matd_print(const matd_t *, const char *)");
}

Assistant:

void matd_print(const matd_t *m, const char *fmt)
{
    assert(m != NULL);
    assert(fmt != NULL);

    if (matd_is_scalar(m)) {
        printf(fmt, MATD_EL(m, 0, 0));
        printf("\n");
    } else {
        for (int i = 0; i < m->nrows; i++) {
            for (int j = 0; j < m->ncols; j++) {
                printf(fmt, MATD_EL(m, i, j));
            }
            printf("\n");
        }
    }
}